

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-alloc.c
# Opt level: O0

ggml_backend_buffer *
ggml_backend_alloc_ctx_tensors_from_buft(ggml_context *ctx,ggml_backend_buffer_type_t buft)

{
  _Bool _Var1;
  ggml_backend_buffer_type_t buft_00;
  size_t size;
  size_t sVar2;
  ggml_tensor *in_RSI;
  ggml_tensor *in_RDI;
  ggml_backend_buffer_t buffer;
  size_t this_size;
  ggml_tensor *t;
  ggml_tensor *first;
  size_t cur_buf_size;
  size_t n_buffers;
  ggml_backend_buffer_t *buffers;
  size_t max_size;
  size_t alignment;
  ggml_backend_buffer_type_t in_stack_ffffffffffffff98;
  ggml_tensor *in_stack_ffffffffffffffa0;
  ulong uVar3;
  ggml_tensor *local_50;
  ulong local_40;
  ggml_backend_buffer_t **buffers_00;
  ggml_context *in_stack_fffffffffffffff8;
  
  _Var1 = ggml_get_no_alloc((ggml_context *)in_RDI);
  if (!_Var1) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml-alloc.c"
               ,0x3d9,"GGML_ASSERT(%s) failed","ggml_get_no_alloc(ctx) == true");
  }
  buft_00 = (ggml_backend_buffer_type_t)
            ggml_backend_buft_get_alignment((ggml_backend_buffer_type_t)0x15c71d);
  size = ggml_backend_buft_get_max_size(in_stack_ffffffffffffff98);
  buffers_00 = (ggml_backend_buffer_t **)0x0;
  local_40 = 0;
  local_50 = ggml_get_first_tensor((ggml_context *)in_RDI);
  do {
    if (local_50 == (ggml_tensor *)0x0) {
      if (local_40 != 0) {
        alloc_tensor_range(in_stack_fffffffffffffff8,in_RDI,in_RSI,buft_00,size,buffers_00,
                           (size_t *)this_size);
      }
      return (ggml_backend_buffer *)0x0;
    }
    uVar3 = 0;
    if ((local_50->data == (void *)0x0) && (local_50->view_src == (ggml_tensor *)0x0)) {
      sVar2 = ggml_backend_buft_get_alloc_size
                        ((ggml_backend_buffer_type_t)0x0,in_stack_ffffffffffffffa0);
      uVar3 = (long)buft_00 + (sVar2 - 1) &
              ((ulong)((long)&buft_00[-1].context + 7U) ^ 0xffffffffffffffff);
    }
    if ((local_40 == 0) || (local_40 + uVar3 <= size)) {
      local_40 = uVar3 + local_40;
    }
    else {
      _Var1 = alloc_tensor_range(in_stack_fffffffffffffff8,in_RDI,in_RSI,buft_00,size,buffers_00,
                                 (size_t *)this_size);
      local_40 = uVar3;
      if (!_Var1) {
        return (ggml_backend_buffer *)0x0;
      }
    }
    local_50 = ggml_get_next_tensor((ggml_context *)in_RDI,local_50);
  } while( true );
}

Assistant:

ggml_backend_buffer_t ggml_backend_alloc_ctx_tensors_from_buft(struct ggml_context * ctx, ggml_backend_buffer_type_t buft) {
    GGML_ASSERT(ggml_get_no_alloc(ctx) == true);

    size_t alignment = ggml_backend_buft_get_alignment(buft);
    size_t max_size = ggml_backend_buft_get_max_size(buft);

    ggml_backend_buffer_t * buffers = NULL;
    size_t n_buffers = 0;

    size_t cur_buf_size = 0;
    struct ggml_tensor * first = ggml_get_first_tensor(ctx);
    for (struct ggml_tensor * t = first; t != NULL; t = ggml_get_next_tensor(ctx, t)) {
        size_t this_size = 0;
        if (t->data == NULL && t->view_src == NULL) {
            this_size = GGML_PAD(ggml_backend_buft_get_alloc_size(buft, t), alignment);
        }

        if (cur_buf_size > 0 && (cur_buf_size + this_size) > max_size) {
            // allocate tensors in the current buffer
            if (!alloc_tensor_range(ctx, first, t, buft, cur_buf_size, &buffers, &n_buffers)) {
                return NULL;
            }
            first = t;
            cur_buf_size = this_size;
        } else {
            cur_buf_size += this_size;
        }
    }

    // allocate remaining tensors
    if (cur_buf_size > 0) {
        if (!alloc_tensor_range(ctx, first, NULL, buft, cur_buf_size, &buffers, &n_buffers)) {
            return NULL;
        }
    }

    if (n_buffers == 0) {
#ifndef NDEBUG
        GGML_LOG_DEBUG("%s: all tensors in the context are already allocated\n", __func__);
#endif
        return NULL;
    }

    ggml_backend_buffer_t buffer;
    if (n_buffers == 1) {
        buffer = buffers[0];
    } else {
        buffer = ggml_backend_multi_buffer_alloc_buffer(buffers, n_buffers);
    }
    free(buffers);
    return buffer;
}